

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_1::FilterCase::verify
          (FilterCase *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  key_type *__k;
  int iVar1;
  undefined4 uVar2;
  long lVar3;
  code *pcVar4;
  bool bVar5;
  int extraout_EAX;
  mapped_type *pmVar6;
  _Rb_tree_node_base *p_Var7;
  size_t __n;
  void *__buf;
  size_t resNdx;
  ulong uVar8;
  size_t filterNdx;
  bool retval;
  byte bVar9;
  long lVar10;
  undefined1 in_stack_fffffffffffffd78;
  allocator<char> local_281;
  ulong local_280;
  TestLog *local_278;
  FilterCase *local_270;
  long *local_268;
  EVP_PKEY_CTX *local_260;
  string local_258;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_238;
  VerificationResult result;
  _Self __tmp;
  map<deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::MessageMeta,_std::less<deqp::gles31::Functional::(anonymous_namespace)::MessageID>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::MessageMeta>_>_>
  counts;
  undefined1 local_1b0 [8];
  uint local_1a8;
  int local_1a4;
  string local_1a0 [368];
  
  local_278 = ((this->super_BaseCase).super_ErrorCase.super_TestCase.super_TestCase.super_TestNode.
              m_testCtx)->m_log;
  counts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &counts._M_t._M_impl.super__Rb_tree_header._M_header;
  counts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  counts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  counts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  __n = siglen;
  local_270 = this;
  local_260 = ctx;
  counts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       counts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&result,"verification",(allocator<char> *)&local_238);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,"Verifying",&local_281);
  tcu::LogSection::LogSection((LogSection *)local_1b0,(string *)&result,&local_258);
  tcu::LogSection::write((LogSection *)local_1b0,(int)local_278,__buf,__n);
  tcu::LogSection::~LogSection((LogSection *)local_1b0);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&result);
  local_270 = (FilterCase *)&(local_270->super_BaseCase).m_results;
  lVar10 = 0;
  local_268 = (long *)sig;
  for (local_280 = 0; lVar3 = *(long *)local_260,
      local_280 < (ulong)((*(long *)(local_260 + 8) - lVar3) / 0x30); local_280 = local_280 + 1) {
    pmVar6 = std::
             map<deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::MessageMeta,_std::less<deqp::gles31::Functional::(anonymous_namespace)::MessageID>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::MessageMeta>_>_>
             ::operator[](&counts,(key_type *)(lVar10 + lVar3));
    if ((pmVar6->severity != 0) && (pmVar6->severity != *(GLenum *)(lVar3 + 0xc + lVar10))) {
      local_1b0 = (undefined1  [8])local_278;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::operator<<((ostream *)&local_1a8,"A message has variable severity between instances: (");
      anon_unknown_1::operator<<((ostream *)&local_1a8,(key_type *)(lVar10 + lVar3));
      std::operator<<((ostream *)&local_1a8,") with severity ");
      result.resultMessage._M_dataplus._M_p._0_4_ = pmVar6->severity;
      result._0_8_ = glu::getDebugMessageSeverityName;
      tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&result,(ostream *)&local_1a8);
      std::operator<<((ostream *)&local_1a8," and ");
      local_258._M_string_length._0_4_ = *(undefined4 *)(lVar3 + 0xc + lVar10);
      local_258._M_dataplus._M_p = (pointer)glu::getDebugMessageSeverityName;
      tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&local_258,(ostream *)&local_1a8);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1b0,
                 "Message severity changed between instances of the same message",
                 (allocator<char> *)&result);
      tcu::ResultCollector::addResult
                ((ResultCollector *)local_270,QP_TEST_RESULT_FAIL,(string *)local_1b0);
      sig = (uchar *)local_268;
      std::__cxx11::string::~string((string *)local_1b0);
    }
    pmVar6->refCount = pmVar6->refCount + 1;
    pmVar6->severity = *(GLenum *)(lVar3 + 0xc + lVar10);
    lVar10 = lVar10 + 0x30;
  }
  local_280 = 0;
  for (uVar8 = 0; lVar10 = *(long *)sig,
      p_Var7 = counts._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
      uVar8 < (ulong)((*(long *)((long)sig + 8) - lVar10) / 0x30); uVar8 = uVar8 + 1) {
    __k = (key_type *)(lVar10 + local_280);
    pmVar6 = std::
             map<deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::MessageMeta,_std::less<deqp::gles31::Functional::(anonymous_namespace)::MessageID>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::MessageMeta>_>_>
             ::operator[](&counts,__k);
    if ((pmVar6->severity != 0) && (pmVar6->severity != *(GLenum *)(lVar10 + 0xc + local_280))) {
      local_1b0 = (undefined1  [8])local_278;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::operator<<((ostream *)&local_1a8,"A message has variable severity between instances: (");
      anon_unknown_1::operator<<((ostream *)&local_1a8,__k);
      std::operator<<((ostream *)&local_1a8,") with severity ");
      result.resultMessage._M_dataplus._M_p._0_4_ = pmVar6->severity;
      result._0_8_ = glu::getDebugMessageSeverityName;
      tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&result,(ostream *)&local_1a8);
      std::operator<<((ostream *)&local_1a8," and ");
      local_258._M_string_length._0_4_ = *(undefined4 *)(lVar10 + 0xc + local_280);
      local_258._M_dataplus._M_p = (pointer)glu::getDebugMessageSeverityName;
      tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&local_258,(ostream *)&local_1a8);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1b0,
                 "Message severity changed between instances of the same message",
                 (allocator<char> *)&result);
      tcu::ResultCollector::addResult
                ((ResultCollector *)local_270,QP_TEST_RESULT_FAIL,(string *)local_1b0);
      sig = (uchar *)local_268;
      std::__cxx11::string::~string((string *)local_1b0);
    }
    pmVar6->resCount = pmVar6->resCount + 1;
    pmVar6->severity = *(GLenum *)(lVar10 + 0xc + local_280);
    local_280 = local_280 + 0x30;
  }
  do {
    if ((_Rb_tree_header *)p_Var7 == &counts._M_t._M_impl.super__Rb_tree_header) {
      tcu::TestLog::endSection(local_278);
      std::
      map<deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::MessageMeta,_std::less<deqp::gles31::Functional::(anonymous_namespace)::MessageID>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::MessageMeta>_>_>
      ::~map(&counts);
      return extraout_EAX;
    }
    iVar1 = *(int *)((long)&p_Var7[1]._M_left + 4);
    uVar2 = *(undefined4 *)((long)&p_Var7[1]._M_parent + 4);
    local_280 = CONCAT44(local_280._4_4_,*(undefined4 *)&p_Var7[1]._M_left);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&result,glcts::fixed_sample_locations_values + 1,&local_281);
    local_268 = (long *)CONCAT44(local_268._4_4_,uVar2);
    local_1a8 = *(uint *)&p_Var7[1]._M_parent;
    local_1b0 = (undefined1  [8])
                (((BaseCase *)(p_Var7 + 1))->super_ErrorCase).super_TestCase.super_TestCase.
                super_TestNode._vptr_TestNode;
    local_260 = (EVP_PKEY_CTX *)CONCAT44(local_260._4_4_,iVar1);
    local_1a4 = iVar1;
    std::__cxx11::string::string(local_1a0,(string *)&result);
    bVar9 = 1;
    lVar10 = 0;
    for (uVar8 = 0; lVar3 = *(long *)siglen, uVar8 < (ulong)((*(long *)(siglen + 8) - lVar3) / 0x30)
        ; uVar8 = uVar8 + 1) {
      pcVar4 = *(code **)(lVar3 + 0x10 + lVar10);
      iVar1 = *(int *)(lVar3 + lVar10);
      if (pcVar4 == *(code **)(lVar3 + 0x18 + lVar10)) {
        if ((((iVar1 == 0x1100) || (iVar1 == local_1b0._0_4_)) &&
            ((iVar1 = *(int *)(lVar3 + 4 + lVar10), iVar1 == 0x1100 || (iVar1 == local_1b0._4_4_))))
           && ((iVar1 = *(int *)(lVar3 + 8 + lVar10), iVar1 == 0x1100 || (iVar1 == local_1a4)))) {
LAB_011d17e7:
          bVar9 = *(byte *)(lVar3 + 0x28 + lVar10);
        }
      }
      else if ((iVar1 == local_1b0._0_4_) && (*(int *)(lVar3 + 4 + lVar10) == local_1b0._4_4_)) {
        local_238._M_current = *(uint **)(lVar3 + 0x18 + lVar10);
        local_258._M_dataplus._M_p = (pointer)pcVar4;
        bVar5 = de::
                contains<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int>
                          ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                            *)&local_258,&local_238,&local_1a8);
        if (bVar5) goto LAB_011d17e7;
      }
      lVar10 = lVar10 + 0x30;
    }
    std::__cxx11::string::~string(local_1a0);
    std::__cxx11::string::~string((string *)&result);
    BaseCase::verifyMessageCount
              (&result,(BaseCase *)(p_Var7 + 1),(MessageID *)((ulong)local_260 & 0xffffffff),
               (GLenum)local_268,(int)local_280,bVar9 & 1,(bool)in_stack_fffffffffffffd78);
    local_1b0 = (undefined1  [8])local_278;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::operator<<((ostream *)&local_1a8,(string *)&result.logMessage);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    if (result.result != QP_TEST_RESULT_PASS) {
      tcu::ResultCollector::addResult
                ((ResultCollector *)local_270,result.result,&result.resultMessage);
    }
    BaseCase::VerificationResult::~VerificationResult(&result);
    p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
  } while( true );
}

Assistant:

void FilterCase::verify (const vector<MessageData>& refMessages, const vector<MessageData>& resMessages, const vector<MessageFilter>& filters)
{
	TestLog&						log		= m_testCtx.getLog();
	map<MessageID, MessageMeta>		counts;

	log << TestLog::Section("verification", "Verifying");

	// Gather message counts & severities, report severity mismatches if found
	for (size_t refNdx = 0; refNdx < refMessages.size(); refNdx++)
	{
		const MessageData&	msg  = refMessages[refNdx];
		MessageMeta&		meta = counts[msg.id];

		if (meta.severity != GL_NONE && meta.severity != msg.severity)
		{
			log << TestLog::Message << "A message has variable severity between instances: (" << msg.id << ") with severity "
				<< glu::getDebugMessageSeverityStr(meta.severity) << " and " << glu::getDebugMessageSeverityStr(msg.severity) << TestLog::EndMessage;
			m_results.addResult(QP_TEST_RESULT_FAIL, "Message severity changed between instances of the same message");
		}

		meta.refCount++;
		meta.severity = msg.severity;
	}

	for (size_t resNdx = 0; resNdx < resMessages.size(); resNdx++)
	{
		const MessageData&	msg  = resMessages[resNdx];
		MessageMeta&		meta = counts[msg.id];

		if (meta.severity != GL_NONE && meta.severity != msg.severity)
		{
			log << TestLog::Message << "A message has variable severity between instances: (" << msg.id << ") with severity "
				<< glu::getDebugMessageSeverityStr(meta.severity) << " and " << glu::getDebugMessageSeverityStr(msg.severity) << TestLog::EndMessage;
			m_results.addResult(QP_TEST_RESULT_FAIL, "Message severity changed between instances of the same message");
		}

		meta.resCount++;
		meta.severity = msg.severity;
	}

	for (map<MessageID, MessageMeta>::const_iterator itr = counts.begin(); itr != counts.end(); itr++)
	{
		const MessageID&	id			= itr->first;
		const GLenum		severity	= itr->second.severity;

		const int			refCount	= itr->second.refCount;
		const int			resCount	= itr->second.resCount;
		const bool			enabled		= isEnabled(filters, MessageData(id, severity, ""));

		VerificationResult	result		= verifyMessageCount(id, severity, refCount, resCount, enabled);

		log << TestLog::Message << result.logMessage << TestLog::EndMessage;

		if (result.result != QP_TEST_RESULT_PASS)
			m_results.addResult(result.result, result.resultMessage);
	}

	log << TestLog::EndSection;
}